

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  Allocator *pAVar1;
  bool bVar2;
  ArenaAllocator *pAVar3;
  idx_t iVar4;
  idx_t in_R8;
  string_t *input_value;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  *state;
  idx_t idx;
  idx_t i;
  string_t *input_values;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  **states;
  UnifiedVectorFormat input_data;
  bool extra_state;
  UnifiedVectorFormat sdata;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffec8;
  UnifiedVectorFormat *in_stack_fffffffffffffed0;
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffed8;
  Vector *in_stack_fffffffffffffee0;
  ArenaAllocator *allocator;
  ulong local_e8;
  UnifiedVectorFormat local_d0;
  undefined1 local_85;
  SelectionVector *local_78;
  UnifiedVectorFormat *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffee0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffa0,(idx_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_85 = HistogramStringFunctor::CreateExtraState(in_R8);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffee0);
  HistogramStringFunctor::PrepareData
            (in_stack_fffffffffffffee0,(idx_t)in_stack_fffffffffffffed8,
             (bool *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pAVar3 = (ArenaAllocator *)
           UnifiedVectorFormat::
           GetData<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>*>
                     ((UnifiedVectorFormat *)&local_78);
  UnifiedVectorFormat::GetData<duckdb::string_t>(&local_d0);
  for (local_e8 = 0; local_e8 < in_R8; local_e8 = local_e8 + 1) {
    SelectionVector::get_index(local_d0.sel,local_e8);
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffed8,
                       (idx_t)in_stack_fffffffffffffed0);
    if (bVar2) {
      allocator = pAVar3;
      iVar4 = SelectionVector::get_index(local_78,local_e8);
      pAVar1 = (&allocator->allocator)[iVar4];
      if (pAVar1->allocate_function == (allocate_function_ptr_t)0x0) {
        in_stack_fffffffffffffed8 =
             StringMapType<duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
             ::CreateEmpty(allocator);
        pAVar1->allocate_function = (allocate_function_ptr_t)in_stack_fffffffffffffed8;
      }
      in_stack_fffffffffffffed0 =
           (UnifiedVectorFormat *)
           OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
           ::operator[]((OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                         *)allocator,(key_type *)in_stack_fffffffffffffed8);
      in_stack_fffffffffffffed0->sel =
           (SelectionVector *)((long)&in_stack_fffffffffffffed0->sel->sel_vector + 1);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}